

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall google::protobuf::DescriptorProto::ByteSize(DescriptorProto *this)

{
  bool bVar1;
  int iVar2;
  string *value;
  MessageOptions *value_00;
  FieldDescriptorProto *pFVar3;
  DescriptorProto *value_01;
  EnumDescriptorProto *value_02;
  DescriptorProto_ExtensionRange *value_03;
  UnknownFieldSet *pUVar4;
  int local_28;
  int local_24;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int total_size;
  DescriptorProto *this_local;
  
  i_1 = 0;
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      value = name_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(value);
      i_1 = iVar2 + 1;
    }
    bVar1 = has_options(this);
    if (bVar1) {
      value_00 = options(this);
      iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::MessageOptions>
                        (value_00);
      i_1 = iVar2 + 1 + i_1;
    }
  }
  iVar2 = field_size(this);
  i_1 = iVar2 + i_1;
  for (i_2 = 0; iVar2 = field_size(this), i_2 < iVar2; i_2 = i_2 + 1) {
    pFVar3 = field(this,i_2);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldDescriptorProto>
                      (pFVar3);
    i_1 = iVar2 + i_1;
  }
  iVar2 = extension_size(this);
  i_1 = iVar2 + i_1;
  for (i_3 = 0; iVar2 = extension_size(this), i_3 < iVar2; i_3 = i_3 + 1) {
    pFVar3 = extension(this,i_3);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldDescriptorProto>
                      (pFVar3);
    i_1 = iVar2 + i_1;
  }
  iVar2 = nested_type_size(this);
  i_1 = iVar2 + i_1;
  for (i_4 = 0; iVar2 = nested_type_size(this), i_4 < iVar2; i_4 = i_4 + 1) {
    value_01 = nested_type(this,i_4);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::DescriptorProto>
                      (value_01);
    i_1 = iVar2 + i_1;
  }
  iVar2 = enum_type_size(this);
  i_1 = iVar2 + i_1;
  for (local_24 = 0; iVar2 = enum_type_size(this), local_24 < iVar2; local_24 = local_24 + 1) {
    value_02 = enum_type(this,local_24);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumDescriptorProto>
                      (value_02);
    i_1 = iVar2 + i_1;
  }
  iVar2 = extension_range_size(this);
  i_1 = iVar2 + i_1;
  for (local_28 = 0; iVar2 = extension_range_size(this), local_28 < iVar2; local_28 = local_28 + 1)
  {
    value_03 = extension_range(this,local_28);
    iVar2 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::DescriptorProto_ExtensionRange>(value_03);
    i_1 = iVar2 + i_1;
  }
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar4);
    i_1 = iVar2 + i_1;
  }
  this->_cached_size_ = i_1;
  return i_1;
}

Assistant:

int DescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.MessageOptions options = 7;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  total_size += 1 * this->field_size();
  for (int i = 0; i < this->field_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->field(i));
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  total_size += 1 * this->extension_size();
  for (int i = 0; i < this->extension_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->extension(i));
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  total_size += 1 * this->nested_type_size();
  for (int i = 0; i < this->nested_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->nested_type(i));
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  total_size += 1 * this->enum_type_size();
  for (int i = 0; i < this->enum_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->enum_type(i));
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  total_size += 1 * this->extension_range_size();
  for (int i = 0; i < this->extension_range_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->extension_range(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}